

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * ImGui::GetTopMostAndVisiblePopupModal(void)

{
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *popup;
  int n;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  popup._4_4_ = (GImGui->OpenPopupStack).Size;
  do {
    popup._4_4_ = popup._4_4_ + -1;
    if (popup._4_4_ < 0) {
      return (ImGuiWindow *)0x0;
    }
    window = (pIVar1->OpenPopupStack).Data[popup._4_4_].Window;
  } while (((window == (ImGuiWindow *)0x0) || ((window->Flags & 0x8000000U) == 0)) ||
          (bVar2 = IsWindowActiveAndVisible(window), !bVar2));
  return window;
}

Assistant:

ImGuiWindow* ImGui::GetTopMostAndVisiblePopupModal()
{
    ImGuiContext& g = *GImGui;
    for (int n = g.OpenPopupStack.Size - 1; n >= 0; n--)
        if (ImGuiWindow* popup = g.OpenPopupStack.Data[n].Window)
            if ((popup->Flags & ImGuiWindowFlags_Modal) && IsWindowActiveAndVisible(popup))
                return popup;
    return NULL;
}